

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::setToolButtonStyle(QToolBar *this,ToolButtonStyle toolButtonStyle)

{
  QToolBarPrivate *pQVar1;
  ToolButtonStyle in_ESI;
  QToolBarPrivate *d;
  undefined4 in_stack_00000018;
  int in_stack_00000028;
  int in_stack_0000002c;
  ToolButtonStyle in_stack_ffffffffffffffdc;
  
  pQVar1 = d_func((QToolBar *)0x6eb0e0);
  (pQVar1->super_QWidgetPrivate).field_0x255 = 1;
  if (pQVar1->toolButtonStyle != in_ESI) {
    pQVar1->toolButtonStyle = in_ESI;
    QWidget::setMinimumSize
              ((QWidget *)CONCAT44(toolButtonStyle,in_stack_00000018),in_stack_0000002c,
               in_stack_00000028);
    toolButtonStyleChanged((QToolBar *)0x6eb136,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void QToolBar::setToolButtonStyle(Qt::ToolButtonStyle toolButtonStyle)
{
    Q_D(QToolBar);
    d->explicitToolButtonStyle = true;
    if (d->toolButtonStyle == toolButtonStyle)
        return;
    d->toolButtonStyle = toolButtonStyle;
    setMinimumSize(0, 0);
    emit toolButtonStyleChanged(d->toolButtonStyle);
}